

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O2

int nni_id_set(nni_id_map *m,uint64_t id,void *val)

{
  nni_id_entry *pnVar1;
  uint32_t uVar2;
  nni_id_entry *pnVar3;
  int iVar4;
  uint32_t uVar5;
  size_t sVar6;
  uint uVar7;
  
  iVar4 = id_resize(m);
  if (iVar4 == 0) {
    sVar6 = id_find(m,id);
    if (sVar6 == 0xffffffffffffffff) {
      uVar2 = m->id_cap;
      uVar5 = m->id_load;
      uVar7 = (uint)id;
      pnVar3 = m->id_entries;
      while( true ) {
        uVar7 = uVar7 & uVar2 - 1;
        uVar5 = uVar5 + 1;
        pnVar1 = pnVar3 + uVar7;
        if (pnVar3[uVar7].val == (void *)0x0) break;
        pnVar1->skips = pnVar1->skips + 1;
        uVar7 = uVar7 * 5 + 1;
      }
      m->id_load = uVar5;
      m->id_count = m->id_count + 1;
      pnVar1->key = id;
    }
    else {
      pnVar1 = m->id_entries + sVar6;
    }
    pnVar1->val = val;
    iVar4 = 0;
  }
  else {
    iVar4 = 2;
  }
  return iVar4;
}

Assistant:

int
nni_id_set(nni_id_map *m, uint64_t id, void *val)
{
	size_t        index;
	nni_id_entry *ent;

	// Try to resize -- if we don't need to, this will be a no-op.
	if (id_resize(m) != 0) {
		return (NNG_ENOMEM);
	}

	// If it already exists, just overwrite the old value.
	if ((index = id_find(m, id)) != (size_t) -1) {
		ent      = &m->id_entries[index];
		ent->val = val;
		return (0);
	}

	index = ID_INDEX(m, id);
	for (;;) {
		ent = &m->id_entries[index];

		// Increment the load count.  We do this each time time we
		// rehash.  This may over-count items that collide on the
		// same rehashing, but this should just cause a table to
		// grow sooner, which is probably a good thing.
		m->id_load++;
		if (ent->val == NULL) {
			m->id_count++;
			ent->key = id;
			ent->val = val;
			return (0);
		}
		// Record the skip count.  This being non-zero informs
		// that a rehash will be necessary.  Without this we
		// would need to scan the entire hash for the match.
		ent->skips++;
		index = ID_NEXT(m, index);
	}
}